

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

void csc2dense(CUPDLPdense *dense,CUPDLPcsc *csc)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  uVar1 = csc->nRows;
  dense->nRows = uVar1;
  uVar2 = csc->nCols;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  dense->nCols = uVar2;
  iVar9 = 0;
  for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    uVar8 = uVar4;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      if (uVar5 == (uint)csc->colMatIdx[iVar9]) {
        *(cupdlp_float *)((long)dense->data + uVar8) = csc->colMatElem[iVar9];
        iVar9 = iVar9 + 1;
      }
      else {
        *(undefined8 *)((long)dense->data + uVar8) = 0;
      }
      uVar8 = uVar8 + (long)(int)uVar2 * 8;
    }
    uVar4 = uVar4 + 8;
  }
  return;
}

Assistant:

void csc2dense(CUPDLPdense *dense, CUPDLPcsc *csc) {
  dense->nRows = csc->nRows;
  dense->nCols = csc->nCols;

  cupdlp_int iRow = 0;
  cupdlp_int iCol = 0;
  cupdlp_int iMatElem = 0;
  for (iCol = 0; iCol < dense->nCols; ++iCol)
    for (iRow = 0; iRow < dense->nRows; ++iRow) {
      if (iRow == csc->colMatIdx[iMatElem]) {
        dense->data[iRow * dense->nCols + iCol] = csc->colMatElem[iMatElem];
        ++iMatElem;
      } else {
        dense->data[iRow * dense->nCols + iCol] = 0;
      }
    }

  return;
}